

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

int __thiscall doctest::Context::run(Context *this)

{
  int *piVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  pointer pvVar5;
  const_iterator __position;
  pointer ppIVar6;
  char *pcVar7;
  TestRunStats *pTVar8;
  __normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
  __last;
  undefined8 uVar9;
  bool bVar10;
  char cVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  int result;
  int iVar18;
  undefined1 *puVar19;
  ContextState *pCVar20;
  __normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
  _Var21;
  size_t sVar22;
  const_iterator cVar23;
  long lVar24;
  byte bVar25;
  uint uVar26;
  code *__comp;
  IReporter **curr;
  ContextState *pCVar27;
  pointer ppIVar28;
  anon_unknown_14 *paVar29;
  TestCase *pTVar30;
  undefined8 uVar31;
  _Ios_Openmode _Var32;
  IReporter **curr_rep;
  ulong uVar33;
  long in_FS_OFFSET;
  vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
  testArray;
  vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_> queryResults
  ;
  timeval t;
  stack_t sigStack;
  set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>
  testSuitesPassingFilt;
  fstream fstr;
  __normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
  local_398;
  __normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
  _Stack_390;
  long local_388;
  undefined1 local_378 [64];
  anon_union_24_2_13149d16_for_String_2 local_338 [5];
  char local_2b0 [24];
  anon_unknown_14 *local_298;
  ContextState *local_290;
  sigaltstack local_288;
  undefined1 local_270 [8];
  undefined1 local_268 [32];
  anon_union_24_2_13149d16_for_String_2 local_248;
  ostream local_230;
  
  pCVar27 = detail::g_cs;
  pCVar20 = this->p;
  is_running_in_test = 1;
  detail::g_cs = pCVar20;
  *(bool *)(in_FS_OFFSET + -0x40) = (pCVar20->super_ContextOptions).no_colors;
  (pCVar20->super_TestRunStats).numAsserts = 0;
  (pCVar20->super_TestRunStats).numAssertsFailed = 0;
  (pCVar20->super_CurrentTestCaseStats).numAssertsCurrentTest = 0;
  (pCVar20->super_CurrentTestCaseStats).numAssertsFailedCurrentTest = 0;
  (pCVar20->super_TestRunStats).numTestCases = 0;
  (pCVar20->super_TestRunStats).numTestCasesPassingFilters = 0;
  (pCVar20->super_TestRunStats).numTestSuitesPassingFilters = 0;
  (pCVar20->super_TestRunStats).numTestCasesFailed = 0;
  std::fstream::fstream(local_248.buf + 8);
  pCVar20 = this->p;
  if ((pCVar20->super_ContextOptions).cout == (ostream *)0x0) {
    if ((pCVar20->super_ContextOptions).quiet == true) {
      puVar19 = discardOut;
    }
    else {
      bVar25 = (pCVar20->super_ContextOptions).out.field_0.buf[0x17];
      if ((char)bVar25 < '\0') {
        uVar26 = (pCVar20->super_ContextOptions).out.field_0.data.size;
      }
      else {
        uVar26 = 0x17 - (bVar25 & 0x1f);
      }
      if (uVar26 == 0) {
        puVar19 = (undefined1 *)&std::cout;
      }
      else {
        if ((char)bVar25 < '\0') {
          _Var32 = (_Ios_Openmode)*(undefined8 *)&(pCVar20->super_ContextOptions).out.field_0;
        }
        else {
          _Var32 = (int)pCVar20 + (_S_trunc|_S_in);
        }
        std::fstream::open(local_248.buf + 8,_Var32);
        puVar19 = (undefined1 *)&local_230;
        pCVar20 = this->p;
      }
    }
    (pCVar20->super_ContextOptions).cout = (ostream *)puVar19;
  }
  uVar31 = (anonymous_namespace)::FatalConditionHandler::altStackSize;
  (anonymous_namespace)::FatalConditionHandler::altStackMem =
       operator_new__((ulong)(anonymous_namespace)::FatalConditionHandler::altStackSize);
  pvVar5 = (pCVar20->filters).
           super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pvVar5[8].super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
      super__Vector_impl_data._M_start ==
      pvVar5[8].super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    String::String((String *)&local_338[0].data,"console",7);
    uVar31 = pvVar5 + 8;
    std::vector<doctest::String,_std::allocator<doctest::String>_>::emplace_back<doctest::String>
              ((vector<doctest::String,_std::allocator<doctest::String>_> *)uVar31,
               (String *)&local_338[0].data);
    if (((long)local_338[0]._16_8_ < 0) &&
       (uVar31 = local_338[0].data.ptr, (ContextState *)local_338[0]._0_8_ != (ContextState *)0x0))
    {
      operator_delete__((void *)local_338[0]._0_8_);
    }
  }
  local_378._48_8_ = pCVar27;
  anon_unknown_14::getReporters();
  if ((_Rb_tree_header *)
      anon_unknown_14::getReporters::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &anon_unknown_14::getReporters::data._M_t._M_impl.super__Rb_tree_header) {
    pCVar20 = (ContextState *)
              anon_unknown_14::getReporters::data._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_left;
    do {
      uVar31 = pCVar20;
      if ((((ContextState *)uVar31)->super_ContextOptions).out.field_0.buf[0x17] < '\0') {
        paVar29 = (anon_unknown_14 *)
                  (((ContextState *)uVar31)->super_ContextOptions).out.field_0.data.ptr;
      }
      else {
        paVar29 = (anon_unknown_14 *)&(((ContextState *)uVar31)->super_ContextOptions).out;
      }
      pCVar20 = this->p;
      pvVar5 = (pCVar20->filters).
               super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar10 = anon_unknown_14::matchesAny
                         (paVar29,*(char **)&pvVar5[8].
                                             super__Vector_base<doctest::String,_std::allocator<doctest::String>_>
                                             ._M_impl.super__Vector_impl_data,
                          (vector<doctest::String,_std::allocator<doctest::String>_> *)
                          pvVar5[8].
                          super__Vector_base<doctest::String,_std::allocator<doctest::String>_>.
                          _M_impl.super__Vector_impl_data._M_finish,false,
                          (pCVar20->super_ContextOptions).case_sensitive);
      if (bVar10) {
        local_338[0]._0_8_ =
             (**(code **)&(((ContextState *)uVar31)->super_ContextOptions).order_by.field_0)
                       (detail::g_cs);
        std::vector<doctest::IReporter*,std::allocator<doctest::IReporter*>>::
        emplace_back<doctest::IReporter*>
                  ((vector<doctest::IReporter*,std::allocator<doctest::IReporter*>> *)
                   &pCVar20->reporters_currently_used,(IReporter **)local_338);
      }
      pCVar20 = (ContextState *)std::_Rb_tree_increment((_Rb_tree_node_base *)uVar31);
    } while (pCVar20 !=
             (ContextState *)&anon_unknown_14::getReporters::data._M_t._M_impl.super__Rb_tree_header
            );
  }
  anon_unknown_14::getListeners();
  if ((_Rb_tree_header *)
      anon_unknown_14::getListeners::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &anon_unknown_14::getListeners::data._M_t._M_impl.super__Rb_tree_header) {
    pCVar20 = (ContextState *)
              anon_unknown_14::getListeners::data._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_left;
    do {
      uVar31 = pCVar20;
      pCVar20 = this->p;
      __position._M_current =
           (pCVar20->reporters_currently_used).
           super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_338[0]._0_8_ =
           (**(code **)&(((ContextState *)uVar31)->super_ContextOptions).order_by.field_0)
                     (detail::g_cs);
      std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::_M_insert_rval
                (&pCVar20->reporters_currently_used,__position,(value_type *)local_338);
      pCVar20 = (ContextState *)std::_Rb_tree_increment((_Rb_tree_node_base *)uVar31);
    } while (pCVar20 !=
             (ContextState *)&anon_unknown_14::getListeners::data._M_t._M_impl.super__Rb_tree_header
            );
  }
  pCVar20 = this->p;
  if (((((pCVar20->super_ContextOptions).no_run != false) ||
       ((pCVar20->super_ContextOptions).version != false)) ||
      ((pCVar20->super_ContextOptions).help != false)) ||
     ((pCVar20->super_ContextOptions).list_reporters == true)) {
    ppIVar28 = (detail::g_cs->reporters_currently_used).
               super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppIVar6 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppIVar28 != ppIVar6) {
      do {
        local_338[0].data.ptr = (ContextState *)0x0;
        local_338[0]._8_8_ = (void *)0x0;
        local_338[0]._16_8_ = 0;
        (**(*ppIVar28)->_vptr_IReporter)(*ppIVar28,local_338);
        ppIVar28 = ppIVar28 + 1;
      } while (ppIVar28 != ppIVar6);
    }
    if ((anonymous_namespace)::FatalConditionHandler::altStackMem != (void *)0x0) {
      operator_delete__((anonymous_namespace)::FatalConditionHandler::altStackMem);
    }
    cVar11 = std::__basic_file<char>::is_open();
    uVar31 = local_378._48_8_;
    if (cVar11 != '\0') {
      std::fstream::close();
    }
    detail::g_cs = (ContextState *)uVar31;
    is_running_in_test = 0;
    pCVar20 = this->p;
    ppIVar28 = (pCVar20->reporters_currently_used).
               super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppIVar6 = (pCVar20->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppIVar28 != ppIVar6) {
      do {
        if (*ppIVar28 != (IReporter *)0x0) {
          (*(*ppIVar28)->_vptr_IReporter[0xd])();
        }
        ppIVar28 = ppIVar28 + 1;
      } while (ppIVar28 != ppIVar6);
      pCVar20 = this->p;
      ppIVar28 = (pCVar20->reporters_currently_used).
                 super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if ((pCVar20->reporters_currently_used).
          super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppIVar28) {
        (pCVar20->reporters_currently_used).
        super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppIVar28;
      }
    }
    if (((pCVar20->super_TestRunStats).numTestCasesFailed == 0) ||
       (iVar18 = 1, (pCVar20->super_ContextOptions).no_exitcode == true)) {
      iVar18 = 0;
    }
    goto LAB_0010c33d;
  }
  local_398._M_current = (TestCase **)0x0;
  _Stack_390._M_current = (TestCase **)0x0;
  local_388 = 0;
  detail::getRegisteredTests();
  if ((_Rb_tree_header *)
      detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header) {
    pCVar20 = (ContextState *)
              detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_338[0]._0_8_ = &(pCVar20->super_ContextOptions).currentTest;
      std::vector<doctest::detail::TestCase_const*,std::allocator<doctest::detail::TestCase_const*>>
      ::emplace_back<doctest::detail::TestCase_const*>
                ((vector<doctest::detail::TestCase_const*,std::allocator<doctest::detail::TestCase_const*>>
                  *)&local_398,(TestCase **)local_338);
      uVar31 = pCVar20;
      pCVar20 = (ContextState *)std::_Rb_tree_increment((_Rb_tree_node_base *)pCVar20);
    } while (pCVar20 !=
             (ContextState *)&detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header);
  }
  __last._M_current = _Stack_390._M_current;
  _Var21._M_current = local_398._M_current;
  pCVar20 = this->p;
  (pCVar20->super_TestRunStats).numTestCases =
       (uint)((ulong)((long)_Stack_390._M_current - (long)local_398._M_current) >> 3);
  if (_Stack_390._M_current != local_398._M_current) {
    uVar31 = &(pCVar20->super_ContextOptions).order_by;
    iVar18 = String::compare((String *)uVar31,"file",true);
    if (iVar18 == 0) {
      __comp = anon_unknown_14::fileOrderComparator;
    }
    else {
      iVar18 = String::compare((String *)uVar31,"suite",true);
      if (iVar18 == 0) {
        __comp = anon_unknown_14::suiteOrderComparator;
      }
      else {
        iVar18 = String::compare((String *)uVar31,"name",true);
        if (iVar18 != 0) {
          iVar18 = String::compare((String *)uVar31,"rand",true);
          if (iVar18 == 0) {
            uVar26 = (pCVar20->super_ContextOptions).rand_seed;
            uVar31 = ZEXT48(uVar26);
            srand(uVar26);
            _Var21._M_current = local_398._M_current;
            for (uVar33 = (long)_Stack_390._M_current - (long)local_398._M_current >> 3; uVar33 != 1
                ; uVar33 = uVar33 - 1) {
              iVar18 = rand();
              pTVar30 = _Var21._M_current[uVar33 - 1];
              iVar18 = (int)((ulong)(long)iVar18 % uVar33);
              _Var21._M_current[uVar33 - 1] = _Var21._M_current[iVar18];
              _Var21._M_current[iVar18] = pTVar30;
            }
          }
          goto LAB_0010c4b3;
        }
        __comp = anon_unknown_14::nameOrderComparator;
      }
    }
    std::
    sort<__gnu_cxx::__normal_iterator<doctest::detail::TestCase_const**,std::vector<doctest::detail::TestCase_const*,std::allocator<doctest::detail::TestCase_const*>>>,bool(*)(doctest::detail::TestCase_const*,doctest::detail::TestCase_const*)>
              (_Var21,__last,__comp);
    uVar31 = _Var21._M_current;
  }
LAB_0010c4b3:
  local_268._16_8_ = local_268;
  local_268[0] = '\0';
  local_268[1] = '\0';
  local_268[2] = '\0';
  local_268[3] = '\0';
  local_268[8] = '\0';
  local_268[9] = '\0';
  local_268[10] = '\0';
  local_268[0xb] = '\0';
  local_268[0xc] = '\0';
  local_268[0xd] = '\0';
  local_268[0xe] = '\0';
  local_268[0xf] = '\0';
  local_248.data.ptr = (char *)0x0;
  pCVar20 = this->p;
  local_268._24_8_ = local_268._16_8_;
  if (((pCVar20->super_ContextOptions).count == false) &&
     ((pCVar20->super_ContextOptions).list_test_cases != true)) {
    local_378._0_8_ = (ostream *)0x0;
    local_378._8_8_ = (char *)0x0;
    local_378._16_8_ = 0;
    bVar10 = true;
    if ((pCVar20->super_ContextOptions).list_test_suites == false) {
      ppIVar6 = (detail::g_cs->reporters_currently_used).
                super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppIVar28 = (detail::g_cs->reporters_currently_used).
                      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppIVar28 != ppIVar6;
          ppIVar28 = ppIVar28 + 1) {
        uVar31 = *ppIVar28;
        (**(code **)&((((ContextState *)uVar31)->super_ContextOptions).cout)->field_0x8)();
      }
      bVar10 = false;
    }
  }
  else {
    local_378._0_8_ = (ostream *)0x0;
    local_378._8_8_ = (char *)0x0;
    local_378._16_8_ = 0;
    bVar10 = true;
  }
  local_378._40_8_ = _Stack_390._M_current;
  _Var21._M_current = local_398._M_current;
  if (local_398._M_current != _Stack_390._M_current) {
    do {
      pCVar20 = (ContextState *)*_Var21._M_current;
      local_290 = this->p;
      if ((pCVar20->super_ContextOptions).out.field_0.buf[0x10] == '\x01') {
        bVar25 = (local_290->super_ContextOptions).no_skip ^ 1;
      }
      else {
        bVar25 = 0;
      }
      pCVar27 = pCVar20;
      if ((pCVar20->super_ContextOptions).binary_name.field_0.buf[0xf] < '\0') {
        pCVar27 = (ContextState *)(pCVar20->super_ContextOptions).cout;
      }
      pvVar5 = (local_290->filters).
               super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar17 = (local_290->super_ContextOptions).case_sensitive;
      local_378._56_8_ = _Var21._M_current;
      bVar12 = anon_unknown_14::matchesAny
                         ((anon_unknown_14 *)pCVar27,
                          *(char **)&(pvVar5->
                                     super__Vector_base<doctest::String,_std::allocator<doctest::String>_>
                                     )._M_impl.super__Vector_impl_data,
                          (vector<doctest::String,_std::allocator<doctest::String>_> *)
                          (pvVar5->
                          super__Vector_base<doctest::String,_std::allocator<doctest::String>_>).
                          _M_impl.super__Vector_impl_data._M_finish,true,bVar17);
      bVar13 = anon_unknown_14::matchesAny
                         ((anon_unknown_14 *)pCVar27,
                          *(char **)&pvVar5[1].
                                     super__Vector_base<doctest::String,_std::allocator<doctest::String>_>
                                     ._M_impl.super__Vector_impl_data,
                          (vector<doctest::String,_std::allocator<doctest::String>_> *)
                          pvVar5[1].
                          super__Vector_base<doctest::String,_std::allocator<doctest::String>_>.
                          _M_impl.super__Vector_impl_data._M_finish,false,bVar17);
      paVar29 = (anon_unknown_14 *)(pCVar20->super_ContextOptions).out.field_0.data.ptr;
      bVar14 = anon_unknown_14::matchesAny
                         (paVar29,*(char **)&pvVar5[2].
                                             super__Vector_base<doctest::String,_std::allocator<doctest::String>_>
                                             ._M_impl.super__Vector_impl_data,
                          (vector<doctest::String,_std::allocator<doctest::String>_> *)
                          pvVar5[2].
                          super__Vector_base<doctest::String,_std::allocator<doctest::String>_>.
                          _M_impl.super__Vector_impl_data._M_finish,true,bVar17);
      local_298 = paVar29;
      bVar15 = anon_unknown_14::matchesAny
                         (paVar29,*(char **)&pvVar5[3].
                                             super__Vector_base<doctest::String,_std::allocator<doctest::String>_>
                                             ._M_impl.super__Vector_impl_data,
                          (vector<doctest::String,_std::allocator<doctest::String>_> *)
                          pvVar5[3].
                          super__Vector_base<doctest::String,_std::allocator<doctest::String>_>.
                          _M_impl.super__Vector_impl_data._M_finish,false,bVar17);
      pTVar30 = (pCVar20->super_ContextOptions).currentTest;
      local_378._32_8_ = pCVar20;
      bVar16 = anon_unknown_14::matchesAny
                         ((anon_unknown_14 *)pTVar30,
                          *(char **)&pvVar5[4].
                                     super__Vector_base<doctest::String,_std::allocator<doctest::String>_>
                                     ._M_impl.super__Vector_impl_data,
                          (vector<doctest::String,_std::allocator<doctest::String>_> *)
                          pvVar5[4].
                          super__Vector_base<doctest::String,_std::allocator<doctest::String>_>.
                          _M_impl.super__Vector_impl_data._M_finish,true,bVar17);
      bVar17 = anon_unknown_14::matchesAny
                         ((anon_unknown_14 *)pTVar30,
                          *(char **)&pvVar5[5].
                                     super__Vector_base<doctest::String,_std::allocator<doctest::String>_>
                                     ._M_impl.super__Vector_impl_data,
                          (vector<doctest::String,_std::allocator<doctest::String>_> *)
                          pvVar5[5].
                          super__Vector_base<doctest::String,_std::allocator<doctest::String>_>.
                          _M_impl.super__Vector_impl_data._M_finish,false,bVar17);
      paVar29 = local_298;
      uVar9 = local_378._32_8_;
      uVar26 = (local_290->super_TestRunStats).numTestCasesPassingFilters;
      if ((!bVar17 && (bVar25 & 1) == 0) && ((bVar16 && (!bVar15 && !bVar13)) && (bVar14 && bVar12))
         ) {
        uVar26 = uVar26 + 1;
        (local_290->super_TestRunStats).numTestCasesPassingFilters = uVar26;
      }
      uVar3 = (local_290->super_ContextOptions).first;
      uVar4 = (local_290->super_ContextOptions).last;
      uVar31 = CONCAT71((int7)((ulong)pTVar30 >> 8),uVar4 < uVar26);
      if ((uVar3 <= uVar26 && (uVar4 < uVar3 || uVar4 >= uVar26)) &&
          ((!bVar17 && (bVar25 & 1) == 0) &&
          ((bVar16 && (!bVar15 && !bVar13)) && (bVar14 && bVar12)))) {
        if ((local_290->super_ContextOptions).count == false) {
          if ((local_290->super_ContextOptions).list_test_cases == true) {
            local_338[0].data.ptr = local_378._32_8_;
            uVar31 = local_378;
            std::vector<doctest::TestCaseData_const*,std::allocator<doctest::TestCaseData_const*>>::
            emplace_back<doctest::TestCaseData_const*>
                      ((vector<doctest::TestCaseData_const*,std::allocator<doctest::TestCaseData_const*>>
                        *)uVar31,(TestCaseData **)local_338);
          }
          else if ((local_290->super_ContextOptions).list_test_suites == true) {
            sVar22 = strlen((char *)local_298);
            String::String((String *)&local_338[0].data,(char *)paVar29,(uint)sVar22);
            uVar31 = local_270;
            cVar23 = std::
                     _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                     ::find((_Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                             *)uVar31,(key_type *)&local_338[0].data);
            if (cVar23._M_node == (_Base_ptr)local_268) {
              cVar11 = *(((ContextOptions *)uVar9)->out).field_0.data.ptr;
              if (((long)local_338[0]._16_8_ < 0) &&
                 (uVar31 = local_338[0].data.ptr,
                 (ContextState *)local_338[0]._0_8_ != (ContextState *)0x0)) {
                operator_delete__((void *)local_338[0]._0_8_);
              }
              if (cVar11 != '\0') {
                local_338[0].data.ptr = uVar9;
                std::
                vector<doctest::TestCaseData_const*,std::allocator<doctest::TestCaseData_const*>>::
                emplace_back<doctest::TestCaseData_const*>
                          ((vector<doctest::TestCaseData_const*,std::allocator<doctest::TestCaseData_const*>>
                            *)local_378,(TestCaseData **)local_338);
                pcVar7 = (((ContextOptions *)uVar9)->out).field_0.data.ptr;
                sVar22 = strlen(pcVar7);
                String::String((String *)&local_338[0].data,pcVar7,(uint)sVar22);
                uVar31 = local_270;
                std::
                _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                ::_M_insert_unique<doctest::String>
                          ((_Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                            *)uVar31,(String *)&local_338[0].data);
                if (((long)local_338[0]._16_8_ < 0) &&
                   (uVar31 = local_338[0].data.ptr,
                   (ContextState *)local_338[0]._0_8_ != (ContextState *)0x0)) {
                  operator_delete__((void *)local_338[0]._0_8_);
                }
                puVar2 = &(this->p->super_TestRunStats).numTestSuitesPassingFilters;
                *puVar2 = *puVar2 + 1;
              }
            }
            else if (((long)local_338[0]._16_8_ < 0) &&
                    (uVar31 = local_338[0].data.ptr,
                    (ContextState *)local_338[0]._0_8_ != (ContextState *)0x0)) {
              operator_delete__((void *)local_338[0]._0_8_);
            }
          }
          else {
            (local_290->super_ContextOptions).currentTest = (TestCase *)local_378._32_8_;
            (local_290->super_CurrentTestCaseStats).failure_flags = 0;
            (local_290->super_CurrentTestCaseStats).seconds = 0.0;
            lVar24 = 0;
            do {
              LOCK();
              pcVar7 = (local_290->numAssertsFailedCurrentTest_atomic).m_atomics[0].padding +
                       lVar24 + -4;
              pcVar7[0] = '\0';
              pcVar7[1] = '\0';
              pcVar7[2] = '\0';
              pcVar7[3] = '\0';
              UNLOCK();
              lVar24 = lVar24 + 0x40;
            } while (lVar24 != 0x800);
            pCVar20 = this->p;
            lVar24 = 0;
            do {
              LOCK();
              pcVar7 = (pCVar20->numAssertsCurrentTest_atomic).m_atomics[0].padding + lVar24 + -4;
              pcVar7[0] = '\0';
              pcVar7[1] = '\0';
              pcVar7[2] = '\0';
              pcVar7[3] = '\0';
              UNLOCK();
              lVar24 = lVar24 + 0x40;
            } while (lVar24 != 0x800);
            std::
            _Rb_tree<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>,_std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>,_std::_Identity<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>,_std::less<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>,_std::allocator<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>_>
            ::clear(&(this->p->subcasesPassed)._M_t);
            ppIVar6 = (detail::g_cs->reporters_currently_used).
                      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (ppIVar28 = (detail::g_cs->reporters_currently_used).
                            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                            ._M_impl.super__Vector_impl_data._M_start; ppIVar28 != ppIVar6;
                ppIVar28 = ppIVar28 + 1) {
              (*(*ppIVar28)->_vptr_IReporter[3])();
            }
            pCVar20 = this->p;
            gettimeofday((timeval *)&local_338[0].data,(__timezone_ptr_t)0x0);
            (pCVar20->timer).m_ticks =
                 (ticks_t)(local_338[0].data.ptr * 1000000 + local_338[0]._8_8_);
            uVar31 = this->p;
            bVar17 = true;
            do {
              ((ContextState *)uVar31)->should_reenter = false;
              ((ContextState *)uVar31)->subcasesCurrentMaxLevel = 0;
              std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::
              _M_erase_at_end(&((ContextState *)uVar31)->subcasesStack,
                              (((ContextState *)uVar31)->subcasesStack).
                              super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                              ._M_impl.super__Vector_impl_data._M_start);
              LOCK();
              (this->p->shouldLogCurrentException)._M_base._M_i = true;
              UNLOCK();
              std::vector<doctest::String,_std::allocator<doctest::String>_>::_M_erase_at_end
                        (&this->p->stringifiedContexts,
                         (this->p->stringifiedContexts).
                         super__Vector_base<doctest::String,_std::allocator<doctest::String>_>.
                         _M_impl.super__Vector_impl_data._M_start);
              (anonymous_namespace)::FatalConditionHandler::isSet = 1;
              local_288.ss_sp = (anonymous_namespace)::FatalConditionHandler::altStackMem;
              local_288.ss_size = (size_t)(anonymous_namespace)::FatalConditionHandler::altStackSize
              ;
              local_288.ss_flags = 0;
              sigaltstack(&local_288,
                          (sigaltstack *)(anonymous_namespace)::FatalConditionHandler::oldSigStack);
              memset(local_338[0].buf + 8,0,0x90);
              local_338[0].data.ptr = anon_unknown_14::FatalConditionHandler::handleSignal;
              local_2b0[0] = '\0';
              local_2b0[1] = '\0';
              local_2b0[2] = '\0';
              local_2b0[3] = '\b';
              puVar19 = (anonymous_namespace)::FatalConditionHandler::oldSigActions;
              lVar24 = 0;
              do {
                sigaction(*(int *)((long)&(anonymous_namespace)::signalDefs + lVar24),
                          (sigaction *)&local_338[0].data,(sigaction *)puVar19);
                lVar24 = lVar24 + 0x10;
                puVar19 = (undefined1 *)((long)puVar19 + 0x98);
              } while (lVar24 != 0x60);
              (**(code **)((long)&(((ContextOptions *)uVar9)->order_by).field_0 + 0x10))();
              anon_unknown_14::FatalConditionHandler::reset();
              anon_unknown_14::FatalConditionHandler::reset();
              uVar31 = this->p;
              if (0 < (((ContextState *)uVar31)->super_ContextOptions).abort_after) {
                pTVar8 = &((ContextState *)uVar31)->super_TestRunStats;
                iVar18 = 0;
                lVar24 = 0;
                do {
                  iVar18 = iVar18 + *(int *)((((ContextState *)uVar31)->
                                             numAssertsFailedCurrentTest_atomic).m_atomics[0].
                                             padding + lVar24 + -4);
                  lVar24 = lVar24 + 0x40;
                } while (lVar24 != 0x800);
                uVar31 = this->p;
                if ((((ContextState *)uVar31)->super_ContextOptions).abort_after <=
                    iVar18 + pTVar8->numAssertsFailed) {
                  piVar1 = &(((ContextState *)uVar31)->super_CurrentTestCaseStats).failure_flags;
                  *(byte *)piVar1 = (byte)*piVar1 | 8;
                  bVar17 = false;
                }
              }
              if (((ContextState *)uVar31)->should_reenter != true) break;
              if (bVar17) {
                ppIVar28 = (detail::g_cs->reporters_currently_used).
                           super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                ppIVar6 = (detail::g_cs->reporters_currently_used).
                          super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                if (ppIVar28 != ppIVar6) {
                  do {
                    (*(*ppIVar28)->_vptr_IReporter[4])(*ppIVar28,uVar9);
                    ppIVar28 = ppIVar28 + 1;
                  } while (ppIVar28 != ppIVar6);
                  uVar31 = this->p;
                  if ((((ContextState *)uVar31)->should_reenter & 1U) == 0) break;
                }
              }
            } while (bVar17);
            detail::ContextState::finalizeTestCaseData((ContextState *)uVar31);
            ppIVar6 = (detail::g_cs->reporters_currently_used).
                      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (ppIVar28 = (detail::g_cs->reporters_currently_used).
                            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                            ._M_impl.super__Vector_impl_data._M_start; ppIVar28 != ppIVar6;
                ppIVar28 = ppIVar28 + 1) {
              uVar31 = *ppIVar28;
              (**(code **)&((((ContextState *)uVar31)->super_ContextOptions).cout)->field_0x28)
                        (uVar31,&detail::g_cs->super_CurrentTestCaseStats);
            }
            pCVar20 = this->p;
            (pCVar20->super_ContextOptions).currentTest = (TestCase *)0x0;
            iVar18 = (pCVar20->super_ContextOptions).abort_after;
            if ((0 < iVar18) && (iVar18 <= (pCVar20->super_TestRunStats).numAssertsFailed)) break;
          }
        }
      }
      else if (!bVar10) {
        ppIVar6 = (detail::g_cs->reporters_currently_used).
                  super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppIVar28 = (detail::g_cs->reporters_currently_used).
                        super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppIVar28 != ppIVar6;
            ppIVar28 = ppIVar28 + 1) {
          uVar31 = *ppIVar28;
          (**(code **)&((((ContextState *)uVar31)->super_ContextOptions).cout)->field_0x58)
                    (uVar31,uVar9);
        }
      }
      _Var21._M_current = (TestCase **)(local_378._56_8_ + 8);
    } while ((TestCase **)(local_378._56_8_ + 8) != (TestCase **)local_378._40_8_);
  }
  if (bVar10) {
    local_338[0]._0_8_ = &detail::g_cs->super_TestRunStats;
    if (detail::g_cs == (ContextState *)0x0) {
      local_338[0]._0_8_ = (ContextState *)0x0;
    }
    local_338[0]._8_8_ = local_378._0_8_;
    local_338[0]._16_4_ = (int)((ulong)(local_378._8_8_ - local_378._0_8_) >> 3);
    ppIVar28 = (detail::g_cs->reporters_currently_used).
               super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppIVar6 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppIVar28 != ppIVar6) {
      do {
        uVar31 = *ppIVar28;
        (*(code *)((((ContextState *)uVar31)->super_ContextOptions).cout)->_vptr_basic_ostream)
                  (uVar31,local_338);
        ppIVar28 = ppIVar28 + 1;
      } while (ppIVar28 != ppIVar6);
    }
  }
  else {
    ppIVar6 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar28 = (detail::g_cs->reporters_currently_used).
                    super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppIVar28 != ppIVar6;
        ppIVar28 = ppIVar28 + 1) {
      uVar31 = *ppIVar28;
      (**(code **)&((((ContextState *)uVar31)->super_ContextOptions).cout)->field_0x10)
                (uVar31,&detail::g_cs->super_TestRunStats);
    }
  }
  run::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)uVar31);
  uVar31 = local_378._48_8_;
  if ((anonymous_namespace)::FatalConditionHandler::altStackMem != (void *)0x0) {
    operator_delete__((anonymous_namespace)::FatalConditionHandler::altStackMem);
  }
  cVar11 = std::__basic_file<char>::is_open();
  if (cVar11 != '\0') {
    std::fstream::close();
  }
  detail::g_cs = (ContextState *)uVar31;
  is_running_in_test = 0;
  pCVar20 = this->p;
  ppIVar28 = (pCVar20->reporters_currently_used).
             super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  ppIVar6 = (pCVar20->reporters_currently_used).
            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppIVar28 != ppIVar6) {
    do {
      if (*ppIVar28 != (IReporter *)0x0) {
        (*(*ppIVar28)->_vptr_IReporter[0xd])();
      }
      ppIVar28 = ppIVar28 + 1;
    } while (ppIVar28 != ppIVar6);
    pCVar20 = this->p;
    ppIVar28 = (pCVar20->reporters_currently_used).
               super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if ((pCVar20->reporters_currently_used).
        super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppIVar28) {
      (pCVar20->reporters_currently_used).
      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppIVar28;
    }
  }
  if (((pCVar20->super_TestRunStats).numTestCasesFailed == 0) ||
     (iVar18 = 1, (pCVar20->super_ContextOptions).no_exitcode == true)) {
    iVar18 = 0;
  }
  if ((ostream *)local_378._0_8_ != (ostream *)0x0) {
    operator_delete((void *)local_378._0_8_,local_378._16_8_ - local_378._0_8_);
  }
  std::
  _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
  ::~_Rb_tree((_Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
               *)local_270);
  if (local_398._M_current != (TestCase **)0x0) {
    operator_delete(local_398._M_current,local_388 - (long)local_398._M_current);
  }
LAB_0010c33d:
  std::fstream::~fstream(local_248.buf + 8);
  return iVar18;
}

Assistant:

int Context::run() {
    using namespace detail;

    // save the old context state in case such was setup - for using asserts out of a testing context
    auto old_cs = g_cs;
    // this is the current contest
    g_cs               = p;
    is_running_in_test = true;

    g_no_colors = p->no_colors;
    p->resetRunData();

    std::fstream fstr;
    if(p->cout == nullptr) {
        if(p->quiet) {
            p->cout = &discardOut;
        } else if(p->out.size()) {
            // to a file if specified
            fstr.open(p->out.c_str(), std::fstream::out);
            p->cout = &fstr;
        } else {
            // stdout by default
            p->cout = &std::cout;
        }
    }

    FatalConditionHandler::allocateAltStackMem();

    auto cleanup_and_return = [&]() {
        FatalConditionHandler::freeAltStackMem();

        if(fstr.is_open())
            fstr.close();

        // restore context
        g_cs               = old_cs;
        is_running_in_test = false;

        // we have to free the reporters which were allocated when the run started
        for(auto& curr : p->reporters_currently_used)
            delete curr;
        p->reporters_currently_used.clear();

        if(p->numTestCasesFailed && !p->no_exitcode)
            return EXIT_FAILURE;
        return EXIT_SUCCESS;
    };

    // setup default reporter if none is given through the command line
    if(p->filters[8].empty())
        p->filters[8].push_back("console");

    // check to see if any of the registered reporters has been selected
    for(auto& curr : getReporters()) {
        if(matchesAny(curr.first.second.c_str(), p->filters[8], false, p->case_sensitive))
            p->reporters_currently_used.push_back(curr.second(*g_cs));
    }

    // TODO: check if there is nothing in reporters_currently_used

    // prepend all listeners
    for(auto& curr : getListeners())
        p->reporters_currently_used.insert(p->reporters_currently_used.begin(), curr.second(*g_cs));

#ifdef DOCTEST_PLATFORM_WINDOWS
    if(isDebuggerActive() && p->no_debug_output == false)
        p->reporters_currently_used.push_back(new DebugOutputWindowReporter(*g_cs));
#endif // DOCTEST_PLATFORM_WINDOWS

    // handle version, help and no_run
    if(p->no_run || p->version || p->help || p->list_reporters) {
        DOCTEST_ITERATE_THROUGH_REPORTERS(report_query, QueryData());

        return cleanup_and_return();
    }

    std::vector<const TestCase*> testArray;
    for(auto& curr : getRegisteredTests())
        testArray.push_back(&curr);
    p->numTestCases = testArray.size();

    // sort the collected records
    if(!testArray.empty()) {
        if(p->order_by.compare("file", true) == 0) {
            std::sort(testArray.begin(), testArray.end(), fileOrderComparator);
        } else if(p->order_by.compare("suite", true) == 0) {
            std::sort(testArray.begin(), testArray.end(), suiteOrderComparator);
        } else if(p->order_by.compare("name", true) == 0) {
            std::sort(testArray.begin(), testArray.end(), nameOrderComparator);
        } else if(p->order_by.compare("rand", true) == 0) {
            std::srand(p->rand_seed);

            // random_shuffle implementation
            const auto first = &testArray[0];
            for(size_t i = testArray.size() - 1; i > 0; --i) {
                int idxToSwap = std::rand() % (i + 1); // NOLINT

                const auto temp = first[i];

                first[i]         = first[idxToSwap];
                first[idxToSwap] = temp;
            }
        } else if(p->order_by.compare("none", true) == 0) {
            // means no sorting - beneficial for death tests which call into the executable
            // with a specific test case in mind - we don't want to slow down the startup times
        }
    }

    std::set<String> testSuitesPassingFilt;

    bool                             query_mode = p->count || p->list_test_cases || p->list_test_suites;
    std::vector<const TestCaseData*> queryResults;

    if(!query_mode)
        DOCTEST_ITERATE_THROUGH_REPORTERS(test_run_start, DOCTEST_EMPTY);

    // invoke the registered functions if they match the filter criteria (or just count them)
    for(auto& curr : testArray) {
        const auto& tc = *curr;

        bool skip_me = false;
        if(tc.m_skip && !p->no_skip)
            skip_me = true;

        if(!matchesAny(tc.m_file.c_str(), p->filters[0], true, p->case_sensitive))
            skip_me = true;
        if(matchesAny(tc.m_file.c_str(), p->filters[1], false, p->case_sensitive))
            skip_me = true;
        if(!matchesAny(tc.m_test_suite, p->filters[2], true, p->case_sensitive))
            skip_me = true;
        if(matchesAny(tc.m_test_suite, p->filters[3], false, p->case_sensitive))
            skip_me = true;
        if(!matchesAny(tc.m_name, p->filters[4], true, p->case_sensitive))
            skip_me = true;
        if(matchesAny(tc.m_name, p->filters[5], false, p->case_sensitive))
            skip_me = true;

        if(!skip_me)
            p->numTestCasesPassingFilters++;

        // skip the test if it is not in the execution range
        if((p->last < p->numTestCasesPassingFilters && p->first <= p->last) ||
           (p->first > p->numTestCasesPassingFilters))
            skip_me = true;

        if(skip_me) {
            if(!query_mode)
                DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_skipped, tc);
            continue;
        }

        // do not execute the test if we are to only count the number of filter passing tests
        if(p->count)
            continue;

        // print the name of the test and don't execute it
        if(p->list_test_cases) {
            queryResults.push_back(&tc);
            continue;
        }

        // print the name of the test suite if not done already and don't execute it
        if(p->list_test_suites) {
            if((testSuitesPassingFilt.count(tc.m_test_suite) == 0) && tc.m_test_suite[0] != '\0') {
                queryResults.push_back(&tc);
                testSuitesPassingFilt.insert(tc.m_test_suite);
                p->numTestSuitesPassingFilters++;
            }
            continue;
        }

        // execute the test if it passes all the filtering
        {
            p->currentTest = &tc;

            p->failure_flags = TestCaseFailureReason::None;
            p->seconds       = 0;

            // reset atomic counters
            p->numAssertsFailedCurrentTest_atomic = 0;
            p->numAssertsCurrentTest_atomic       = 0;

            p->subcasesPassed.clear();

            DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_start, tc);

            p->timer.start();
            
            bool run_test = true;

            do {
                // reset some of the fields for subcases (except for the set of fully passed ones)
                p->should_reenter          = false;
                p->subcasesCurrentMaxLevel = 0;
                p->subcasesStack.clear();

                p->shouldLogCurrentException = true;

                // reset stuff for logging with INFO()
                p->stringifiedContexts.clear();

#ifndef DOCTEST_CONFIG_NO_EXCEPTIONS
                try {
#endif // DOCTEST_CONFIG_NO_EXCEPTIONS
// MSVC 2015 diagnoses fatalConditionHandler as unused (because reset() is a static method)
DOCTEST_MSVC_SUPPRESS_WARNING_WITH_PUSH(4101) // unreferenced local variable
                    FatalConditionHandler fatalConditionHandler; // Handle signals
                    // execute the test
                    tc.m_test();
                    fatalConditionHandler.reset();
DOCTEST_MSVC_SUPPRESS_WARNING_POP
#ifndef DOCTEST_CONFIG_NO_EXCEPTIONS
                } catch(const TestFailureException&) {
                    p->failure_flags |= TestCaseFailureReason::AssertFailure;
                } catch(...) {
                    DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_exception,
                                                      {translateActiveException(), false});
                    p->failure_flags |= TestCaseFailureReason::Exception;
                }
#endif // DOCTEST_CONFIG_NO_EXCEPTIONS

                // exit this loop if enough assertions have failed - even if there are more subcases
                if(p->abort_after > 0 &&
                   p->numAssertsFailed + p->numAssertsFailedCurrentTest_atomic >= p->abort_after) {
                    run_test = false;
                    p->failure_flags |= TestCaseFailureReason::TooManyFailedAsserts;
                }
                
                if(p->should_reenter && run_test)
                    DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_reenter, tc);
                if(!p->should_reenter)
                    run_test = false;
            } while(run_test);

            p->finalizeTestCaseData();

            DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_end, *g_cs);

            p->currentTest = nullptr;

            // stop executing tests if enough assertions have failed
            if(p->abort_after > 0 && p->numAssertsFailed >= p->abort_after)
                break;
        }
    }

    if(!query_mode) {
        DOCTEST_ITERATE_THROUGH_REPORTERS(test_run_end, *g_cs);
    } else {
        QueryData qdata;
        qdata.run_stats = g_cs;
        qdata.data      = queryResults.data();
        qdata.num_data  = unsigned(queryResults.size());
        DOCTEST_ITERATE_THROUGH_REPORTERS(report_query, qdata);
    }

    // see these issues on the reasoning for this:
    // - https://github.com/onqtam/doctest/issues/143#issuecomment-414418903
    // - https://github.com/onqtam/doctest/issues/126
    auto DOCTEST_FIX_FOR_MACOS_LIBCPP_IOSFWD_STRING_LINK_ERRORS = []() DOCTEST_NOINLINE
        { std::cout << std::string(); };
    DOCTEST_FIX_FOR_MACOS_LIBCPP_IOSFWD_STRING_LINK_ERRORS();

    return cleanup_and_return();
}